

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GaussianPuffRecord.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GaussianPuffRecord::Encode(GaussianPuffRecord *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  GaussianPuffRecord *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,(this->super_EnvironmentRecord).m_ui32EnvRecTyp);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->super_EnvironmentRecord).m_ui16Length);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->super_EnvironmentRecord).m_ui8Index);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->super_EnvironmentRecord).m_ui8Padding);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_PuffLocation).super_DataTypeBase);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_OrigLocation).super_DataTypeBase);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_Sigma).super_DataTypeBase);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_DDTSigma).super_DataTypeBase);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_Ori).super_DataTypeBase);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_Velocity).super_DataTypeBase);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_AngularVelocity).super_DataTypeBase);
  KDataStream::operator<<(pKVar1,(float)this->m_f32CentHeight);
  return;
}

Assistant:

void GaussianPuffRecord::Encode( KDataStream & stream ) const
{
    stream << m_ui32EnvRecTyp
           << m_ui16Length
           << m_ui8Index
           << m_ui8Padding
           << KDIS_STREAM m_PuffLocation
           << KDIS_STREAM m_OrigLocation
           << KDIS_STREAM m_Sigma
           << KDIS_STREAM m_DDTSigma
           << KDIS_STREAM m_Ori
           << KDIS_STREAM m_Velocity
           << KDIS_STREAM m_AngularVelocity
           << m_f32CentHeight;
}